

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

string * __thiscall
flatbuffers::cpp::CppGenerator::GenCreateParam_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,FieldDef *field)

{
  undefined8 def;
  bool bVar1;
  SymbolTable<flatbuffers::Value> *pSVar2;
  Value *pVVar3;
  char *__s;
  bool bVar4;
  byte local_101a;
  byte local_1019;
  string local_f18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ed8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_eb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e98;
  string *type_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_df0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_dd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_db0;
  allocator<char> local_d89;
  string local_d88;
  Value *local_d68;
  Value *pack_name_1;
  string local_d58;
  Value *local_d38;
  Value *native_type_1;
  SymbolTable<flatbuffers::Value> *struct_attribs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ce8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cc8;
  allocator<char> local_ca1;
  string local_ca0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c20;
  string local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_bc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ba0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  undefined1 local_aa0 [8];
  string type_2;
  string local_a78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  undefined1 local_998 [8];
  string basetype;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_958;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_938;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_918;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_898;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_878;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_858;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_838;
  undefined1 local_818 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> enum_value;
  string *type_1;
  string underlying_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_790;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_770;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_750;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_730;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_710;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6f0;
  string local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_690;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_670;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_630;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  allocator<char> local_5a9;
  string local_5a8;
  string local_588;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_568;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  allocator<char> local_4e1;
  string local_4e0;
  Value *local_4c0;
  Value *pack_name;
  allocator<char> local_491;
  string local_490;
  string local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  allocator<char> local_3e9;
  string local_3e8;
  Value *local_3c8;
  Value *native_type;
  SymbolTable<flatbuffers::Value> *struct_attrs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  string local_2f8;
  undefined1 local_2d8 [8];
  Type vector_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  char *local_238;
  char *empty_value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 local_1c1;
  string local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  string type;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string value;
  FieldDef *field_local;
  CppGenerator *this_local;
  string *code;
  
  value.field_2._8_8_ = field;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,"_o->",&local_41);
  std::allocator<char>::~allocator(&local_41);
  if (*(int *)(value.field_2._8_8_ + 200) == 1) {
    Name_abi_cxx11_(&local_98,this,(FieldDef *)value.field_2._8_8_);
    StripUnionType(&local_78,this,&local_98);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::operator+=((string *)local_40,".type");
  }
  else {
    Name_abi_cxx11_(&local_b8,this,(FieldDef *)value.field_2._8_8_);
    std::__cxx11::string::operator+=((string *)local_40,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  type.field_2._M_local_buf[0xe] = '\0';
  type.field_2._M_local_buf[0xd] = '\0';
  bVar1 = IsVector((Type *)(value.field_2._8_8_ + 200));
  bVar4 = false;
  if (!bVar1) {
    pSVar2 = (SymbolTable<flatbuffers::Value> *)(value.field_2._8_8_ + 0x58);
    std::allocator<char>::allocator();
    type.field_2._M_local_buf[0xe] = '\x01';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"cpp_type",(allocator<char> *)(type.field_2._M_local_buf + 0xf));
    type.field_2._M_local_buf[0xd] = '\x01';
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(pSVar2,&local_d8);
    bVar4 = pVVar3 != (Value *)0x0;
  }
  if ((type.field_2._M_local_buf[0xd] & 1U) != 0) {
    std::__cxx11::string::~string((string *)&local_d8);
  }
  if ((type.field_2._M_local_buf[0xe] & 1U) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)(type.field_2._M_local_buf + 0xf));
  }
  if (bVar4) {
    GenTypeBasic_abi_cxx11_((string *)local_100,this,(Type *)(value.field_2._8_8_ + 200),false);
    std::operator+(&local_1a0,"_rehasher ? static_cast<",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::operator+(&local_180,&local_1a0,">((*_rehasher)(");
    std::operator+(&local_160,&local_180,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    GenPtrGet_abi_cxx11_(&local_1c0,this,(FieldDef *)value.field_2._8_8_);
    std::operator+(&local_140,&local_160,&local_1c0);
    std::operator+(&local_120,&local_140,")) : 0");
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
    std::__cxx11::string::~string((string *)&local_1c0);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::__cxx11::string::~string((string *)local_100);
  }
  local_1c1 = 0;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  switch(*(undefined4 *)(value.field_2._8_8_ + 200)) {
  case 0xd:
    if ((*(byte *)(value.field_2._8_8_ + 0x112) & 1) == 0) {
      __s = "";
      if ((*(byte *)(value.field_2._8_8_ + 0x115) & 1) != 0) {
        __s = "<::flatbuffers::Offset64>";
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_228,__s,(allocator<char> *)((long)&empty_value + 7));
      std::operator+(&local_208,"_fbb.CreateString",&local_228);
      std::operator+(&local_1e8,&local_208,"(");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_1e8);
      std::__cxx11::string::~string((string *)&local_208);
      std::__cxx11::string::~string((string *)&local_228);
      std::allocator<char>::~allocator((allocator<char> *)((long)&empty_value + 7));
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_fbb.CreateSharedString(");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_40);
    std::__cxx11::string::push_back((char)__return_storage_ptr__);
    bVar4 = FieldDef::IsRequired((FieldDef *)value.field_2._8_8_);
    if (!bVar4) {
      local_238 = "_fbb.CreateSharedString(\"\")";
      if (((this->opts_).super_IDLOptions.set_empty_strings_to_null & 1U) != 0) {
        local_238 = "0";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type.fixed_length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     ".empty() ? ");
      std::operator+(&local_298,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &vector_type.fixed_length,local_238);
      std::operator+(&local_278,&local_298," : ");
      std::operator+(&local_258,&local_278,__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_258);
      std::__cxx11::string::~string((string *)&local_258);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&vector_type.fixed_length);
    }
    break;
  case 0xe:
  case 0x12:
    Type::VectorType((Type *)local_2d8,(Type *)(value.field_2._8_8_ + 200));
    switch(local_2d8._0_4_) {
    case 1:
      StripUnionType((string *)((long)&underlying_type.field_2 + 8),this,(string *)local_40);
      std::__cxx11::string::operator=
                ((string *)local_40,(string *)(underlying_type.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(underlying_type.field_2._M_local_buf + 8));
      GenTypeBasic_abi_cxx11_((string *)&type_1,this,(Type *)local_2d8,false);
      if (((this->opts_).super_IDLOptions.scoped_enums & 1U) == 0) {
        std::__cxx11::string::string
                  ((string *)(enum_value.field_2._M_local_buf + 8),(string *)&type_1);
      }
      else {
        Name_abi_cxx11_((string *)((long)&enum_value.field_2 + 8),this,
                        *(Definition **)(value.field_2._8_8_ + 0xd8));
      }
      std::operator+(&local_838,"__va->_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818,
                     &local_838,"[i].type");
      std::__cxx11::string::~string((string *)&local_838);
      if (((this->opts_).super_IDLOptions.scoped_enums & 1U) == 0) {
        std::operator+(&local_8b8,"static_cast<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type_1)
        ;
        std::operator+(&local_898,&local_8b8,">(");
        std::operator+(&local_878,&local_898,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_818);
        std::operator+(&local_858,&local_878,")");
        std::__cxx11::string::operator=((string *)local_818,(string *)&local_858);
        std::__cxx11::string::~string((string *)&local_858);
        std::__cxx11::string::~string((string *)&local_878);
        std::__cxx11::string::~string((string *)&local_898);
        std::__cxx11::string::~string((string *)&local_8b8);
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&basetype.field_2 + 8),"_fbb.CreateVector<",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&enum_value.field_2 + 8));
      std::operator+(&local_958,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&basetype.field_2 + 8),">(");
      std::operator+(&local_938,&local_958,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_918,&local_938,".size(), [](size_t i, _VectorArgs *__va) { return ");
      std::operator+(&local_8f8,&local_918,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_818)
      ;
      std::operator+(&local_8d8,&local_8f8,"; }, &_va)");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8d8);
      std::__cxx11::string::~string((string *)&local_8f8);
      std::__cxx11::string::~string((string *)&local_918);
      std::__cxx11::string::~string((string *)&local_938);
      std::__cxx11::string::~string((string *)&local_958);
      std::__cxx11::string::~string((string *)(basetype.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_818);
      std::__cxx11::string::~string((string *)(enum_value.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&type_1);
      break;
    case 2:
      std::operator+(&local_710,"_fbb.CreateVector(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_6f0,&local_710,")");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_6f0);
      std::__cxx11::string::~string((string *)&local_710);
      break;
    default:
      if ((*(long *)(value.field_2._8_8_ + 0xd8) == 0) ||
         (bVar4 = VectorElementUserFacing(this,(Type *)local_2d8), bVar4)) {
        pSVar2 = (SymbolTable<flatbuffers::Value> *)(value.field_2._8_8_ + 0x58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a78,"cpp_type",
                   (allocator<char> *)(type_2.field_2._M_local_buf + 0xf));
        pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(pSVar2,&local_a78);
        std::__cxx11::string::~string((string *)&local_a78);
        std::allocator<char>::~allocator((allocator<char> *)(type_2.field_2._M_local_buf + 0xf));
        if (pVVar3 == (Value *)0x0) {
          if (*(int *)(value.field_2._8_8_ + 200) == 0x12) {
            std::operator+(&local_c40,"_fbb.CreateVector64(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
            std::operator+(&local_c20,&local_c40,")");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c20);
            std::__cxx11::string::~string((string *)&local_c20);
            std::__cxx11::string::~string((string *)&local_c40);
          }
          else {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_fbb.CreateVector");
            if ((*(byte *)(value.field_2._8_8_ + 0x115) & 1) != 0) {
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,"64<::flatbuffers::Vector>");
            }
            std::operator+(&local_c80,"(",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_40);
            std::operator+(&local_c60,&local_c80,")");
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_c60);
            std::__cxx11::string::~string((string *)&local_c60);
            std::__cxx11::string::~string((string *)&local_c80);
          }
        }
        else {
          GenTypeBasic_abi_cxx11_((string *)local_aa0,this,(Type *)local_2d8,false);
          std::operator+(&local_b20,"_fbb.CreateVector<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_aa0);
          std::operator+(&local_b00,&local_b20,">(");
          std::operator+(&local_ae0,&local_b00,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_ac0,&local_ae0,".size(), ");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_ac0);
          std::__cxx11::string::~string((string *)&local_ac0);
          std::__cxx11::string::~string((string *)&local_ae0);
          std::__cxx11::string::~string((string *)&local_b00);
          std::__cxx11::string::~string((string *)&local_b20);
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"[](size_t i, _VectorArgs *__va) { ");
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"return __va->__rehasher ? ");
          std::operator+(&local_b60,"static_cast<",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_aa0);
          std::operator+(&local_b40,&local_b60,">((*__va->__rehasher)");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b40);
          std::__cxx11::string::~string((string *)&local_b40);
          std::__cxx11::string::~string((string *)&local_b60);
          std::operator+(&local_be0,"(__va->_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_bc0,&local_be0,"[i]");
          GenPtrGet_abi_cxx11_(&local_c00,this,(FieldDef *)value.field_2._8_8_);
          std::operator+(&local_ba0,&local_bc0,&local_c00);
          std::operator+(&local_b80,&local_ba0,")) : 0");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b80);
          std::__cxx11::string::~string((string *)&local_b80);
          std::__cxx11::string::~string((string *)&local_ba0);
          std::__cxx11::string::~string((string *)&local_c00);
          std::__cxx11::string::~string((string *)&local_bc0);
          std::__cxx11::string::~string((string *)&local_be0);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"; }, &_va )");
          std::__cxx11::string::~string((string *)local_aa0);
        }
      }
      else {
        GenTypeBasic_abi_cxx11_
                  ((string *)local_998,this,(Type *)(*(long *)(value.field_2._8_8_ + 0xd8) + 0xd0),
                   false);
        std::operator+(&local_a58,"_fbb.CreateVectorScalarCast<",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_998);
        std::operator+(&local_a38,&local_a58,">(::flatbuffers::data(");
        std::operator+(&local_a18,&local_a38,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_9f8,&local_a18,"), ");
        std::operator+(&local_9d8,&local_9f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_9b8,&local_9d8,".size())");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_9b8);
        std::__cxx11::string::~string((string *)&local_9b8);
        std::__cxx11::string::~string((string *)&local_9d8);
        std::__cxx11::string::~string((string *)&local_9f8);
        std::__cxx11::string::~string((string *)&local_a18);
        std::__cxx11::string::~string((string *)&local_a38);
        std::__cxx11::string::~string((string *)&local_a58);
        std::__cxx11::string::~string((string *)local_998);
      }
      break;
    case 0xd:
      NativeString_abi_cxx11_(&local_2f8,this,(FieldDef *)value.field_2._8_8_);
      bVar4 = std::operator==(&local_2f8,"std::string");
      std::__cxx11::string::~string((string *)&local_2f8);
      if (bVar4) {
        std::operator+(&local_338,"_fbb.CreateVectorOfStrings(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_318,&local_338,")");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_318);
        std::__cxx11::string::~string((string *)&local_318);
        std::__cxx11::string::~string((string *)&local_338);
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,
                   "_fbb.CreateVector<::flatbuffers::Offset<::flatbuffers::String>> ");
        std::operator+(&local_378,"(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_358,&local_378,".size(), ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&local_378);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"[](size_t i, _VectorArgs *__va) { ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &struct_attrs,"return __va->__fbb->CreateString(__va->_",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_398,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &struct_attrs,"[i]);");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_398);
        std::__cxx11::string::~string((string *)&local_398);
        std::__cxx11::string::~string((string *)&struct_attrs);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," }, &_va )");
      }
      break;
    case 0xf:
      bVar4 = IsStruct((Type *)local_2d8);
      if (bVar4) {
        pVVar3 = (Value *)(*(long *)(value.field_2._8_8_ + 0xd0) + 0x58);
        native_type = pVVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3e8,"native_type",&local_3e9);
        pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                           ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_3e8);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator(&local_3e9);
        local_3c8 = pVVar3;
        if (pVVar3 == (Value *)0x0) {
          if (*(int *)(value.field_2._8_8_ + 200) == 0x12) {
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"_fbb.CreateVectorOfStructs64");
          }
          else {
            std::__cxx11::string::operator+=
                      ((string *)__return_storage_ptr__,"_fbb.CreateVectorOfStructs");
            if ((*(byte *)(value.field_2._8_8_ + 0x115) & 1) != 0) {
              std::__cxx11::string::operator+=
                        ((string *)__return_storage_ptr__,"64<::flatbuffers::Vector>");
            }
          }
          std::operator+(&local_548,"(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_528,&local_548,")");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_528);
          std::__cxx11::string::~string((string *)&local_528);
          std::__cxx11::string::~string((string *)&local_548);
        }
        else {
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,"_fbb.CreateVectorOfNativeStructs<");
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_490,"",&local_491);
          BaseGenerator::WrapInNameSpace
                    (&local_470,&this->super_BaseGenerator,(Definition *)vector_type._0_8_,
                     &local_490);
          std::operator+(&local_450,&local_470,", ");
          std::operator+(&local_430,&local_450,&local_3c8->constant);
          std::operator+(&local_410,&local_430,">");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_410);
          std::__cxx11::string::~string((string *)&local_410);
          std::__cxx11::string::~string((string *)&local_430);
          std::__cxx11::string::~string((string *)&local_450);
          std::__cxx11::string::~string((string *)&local_470);
          std::__cxx11::string::~string((string *)&local_490);
          std::allocator<char>::~allocator(&local_491);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &pack_name,"(",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&pack_name);
          std::__cxx11::string::~string((string *)&pack_name);
          pVVar3 = native_type;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_4e0,"native_type_pack_name",&local_4e1);
          pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                             ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_4e0);
          std::__cxx11::string::~string((string *)&local_4e0);
          std::allocator<char>::~allocator(&local_4e1);
          local_4c0 = pVVar3;
          if (pVVar3 != (Value *)0x0) {
            std::operator+(&local_508,", ::flatbuffers::Pack",&pVVar3->constant);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_508);
            std::__cxx11::string::~string((string *)&local_508);
          }
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
        }
      }
      else {
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"_fbb.CreateVector<::flatbuffers::Offset<");
        def = vector_type._0_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_5a8,"",&local_5a9);
        BaseGenerator::WrapInNameSpace
                  (&local_588,&this->super_BaseGenerator,(Definition *)def,&local_5a8);
        std::operator+(&local_568,&local_588,">> ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_568);
        std::__cxx11::string::~string((string *)&local_568);
        std::__cxx11::string::~string((string *)&local_588);
        std::__cxx11::string::~string((string *)&local_5a8);
        std::allocator<char>::~allocator(&local_5a9);
        std::operator+(&local_5f0,"(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_5d0,&local_5f0,".size(), ");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5d0);
        std::__cxx11::string::~string((string *)&local_5f0);
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,"[](size_t i, _VectorArgs *__va) { ");
        std::operator+(&local_610,"return Create",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       vector_type._0_8_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_610);
        std::__cxx11::string::~string((string *)&local_610);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"(*__va->__fbb, ");
        if ((*(byte *)(value.field_2._8_8_ + 0x113) & 1) == 0) {
          std::operator+(&local_6b0,"__va->_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_690,&local_6b0,"[i]");
          GenPtrGet_abi_cxx11_(&local_6d0,this,(FieldDef *)value.field_2._8_8_);
          std::operator+(&local_670,&local_690,&local_6d0);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_670);
          std::__cxx11::string::~string((string *)&local_670);
          std::__cxx11::string::~string((string *)&local_6d0);
          std::__cxx11::string::~string((string *)&local_690);
          std::__cxx11::string::~string((string *)&local_6b0);
        }
        else {
          std::operator+(&local_650,"&(__va->_",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::operator+(&local_630,&local_650,"[i])");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_630);
          std::__cxx11::string::~string((string *)&local_630);
          std::__cxx11::string::~string((string *)&local_650);
        }
        std::__cxx11::string::operator+=
                  ((string *)__return_storage_ptr__,", __va->__rehasher); }, &_va )");
      }
      break;
    case 0x10:
      std::operator+(&local_790,"_fbb.CreateVector<::flatbuffers::Offset<void>>(",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_770,&local_790,
                     ".size(), [](size_t i, _VectorArgs *__va) { return __va->_");
      std::operator+(&local_750,&local_770,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(&local_730,&local_750,"[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)");
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_730);
      std::__cxx11::string::~string((string *)&local_730);
      std::__cxx11::string::~string((string *)&local_750);
      std::__cxx11::string::~string((string *)&local_770);
      std::__cxx11::string::~string((string *)&local_790);
    }
    pSVar2 = (SymbolTable<flatbuffers::Value> *)(value.field_2._8_8_ + 0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ca0,"nested_flatbuffer",&local_ca1);
    pVVar3 = SymbolTable<flatbuffers::Value>::Lookup(pSVar2,&local_ca0);
    local_1019 = 1;
    if (pVVar3 == (Value *)0x0) {
      local_101a = 0;
      if (((this->opts_).super_IDLOptions.set_empty_vectors_to_null & 1U) != 0) {
        bVar4 = FieldDef::IsRequired((FieldDef *)value.field_2._8_8_);
        local_101a = bVar4 ^ 0xff;
      }
      local_1019 = local_101a;
    }
    std::__cxx11::string::~string((string *)&local_ca0);
    std::allocator<char>::~allocator(&local_ca1);
    if ((local_1019 & 1) != 0) {
      std::operator+(&local_d08,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     ".size() ? ");
      std::operator+(&local_ce8,&local_d08,__return_storage_ptr__);
      std::operator+(&local_cc8,&local_ce8," : 0");
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_cc8);
      std::__cxx11::string::~string((string *)&local_ce8);
      std::__cxx11::string::~string((string *)&local_d08);
    }
    break;
  case 0xf:
    bVar4 = IsStruct((Type *)(value.field_2._8_8_ + 200));
    if (bVar4) {
      pVVar3 = (Value *)(*(long *)(value.field_2._8_8_ + 0xd0) + 0x58);
      native_type_1 = pVVar3;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d58,"native_type",(allocator<char> *)((long)&pack_name_1 + 7));
      pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                         ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_d58);
      std::__cxx11::string::~string((string *)&local_d58);
      std::allocator<char>::~allocator((allocator<char> *)((long)&pack_name_1 + 7));
      local_d38 = pVVar3;
      if (pVVar3 == (Value *)0x0) {
        if ((*(byte *)(value.field_2._8_8_ + 0x113) & 1) == 0) {
          std::operator+(&local_e70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40," ? ");
          std::operator+(&local_e50,&local_e70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          GenPtrGet_abi_cxx11_((string *)&type_3,this,(FieldDef *)value.field_2._8_8_);
          std::operator+(&local_e30,&local_e50,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &type_3);
          std::operator+(&local_e10,&local_e30," : nullptr");
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_e10);
          std::__cxx11::string::~string((string *)&local_e10);
          std::__cxx11::string::~string((string *)&local_e30);
          std::__cxx11::string::~string((string *)&type_3);
          std::__cxx11::string::~string((string *)&local_e50);
          std::__cxx11::string::~string((string *)&local_e70);
        }
        else {
          std::operator+(&local_df0,"&",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_40);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_df0);
          std::__cxx11::string::~string((string *)&local_df0);
        }
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"::flatbuffers::Pack");
        pVVar3 = native_type_1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_d88,"native_type_pack_name",&local_d89);
        pVVar3 = SymbolTable<flatbuffers::Value>::Lookup
                           ((SymbolTable<flatbuffers::Value> *)pVVar3,&local_d88);
        std::__cxx11::string::~string((string *)&local_d88);
        std::allocator<char>::~allocator(&local_d89);
        local_d68 = pVVar3;
        if (pVVar3 != (Value *)0x0) {
          std::__cxx11::string::operator+=
                    ((string *)__return_storage_ptr__,(string *)&pVVar3->constant);
        }
        std::operator+(&local_dd0,"(",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40
                      );
        std::operator+(&local_db0,&local_dd0,")");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_db0);
        std::__cxx11::string::~string((string *)&local_dd0);
      }
    }
    else {
      local_e98 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                   (value.field_2._8_8_ + 0xd0);
      std::operator+(&local_ed8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                     " ? Create");
      std::operator+(&local_eb8,&local_ed8,local_e98);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_eb8);
      std::__cxx11::string::~string((string *)&local_ed8);
      std::operator+(&local_ef8,"(_fbb, ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_ef8);
      std::__cxx11::string::~string((string *)&local_ef8);
      if ((*(byte *)(value.field_2._8_8_ + 0x113) & 1) == 0) {
        GenPtrGet_abi_cxx11_(&local_f18,this,(FieldDef *)value.field_2._8_8_);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_f18);
        std::__cxx11::string::~string((string *)&local_f18);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", _rehasher) : 0");
    }
    break;
  case 0x10:
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &struct_attribs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   ".Pack(_fbb)");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&struct_attribs);
    std::__cxx11::string::~string((string *)&struct_attribs);
    break;
  default:
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_40);
  }
  local_1c1 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GenCreateParam(const FieldDef &field) {
    std::string value = "_o->";
    if (field.value.type.base_type == BASE_TYPE_UTYPE) {
      value += StripUnionType(Name(field));
      value += ".type";
    } else {
      value += Name(field);
    }
    if (!IsVector(field.value.type) && field.attributes.Lookup("cpp_type")) {
      auto type = GenTypeBasic(field.value.type, false);
      value =
          "_rehasher ? "
          "static_cast<" +
          type + ">((*_rehasher)(" + value + GenPtrGet(field) + ")) : 0";
    }

    std::string code;
    switch (field.value.type.base_type) {
      // String fields are of the form:
      //   _fbb.CreateString(_o->field)
      // or
      //   _fbb.CreateSharedString(_o->field)
      case BASE_TYPE_STRING: {
        if (!field.shared) {
          code +=
              "_fbb.CreateString" +
              std::string(field.offset64 ? "<::flatbuffers::Offset64>" : "") +
              "(";
        } else {
          code += "_fbb.CreateSharedString(";
        }
        code += value;
        code.push_back(')');

        // For optional fields, check to see if there actually is any data
        // in _o->field before attempting to access it. If there isn't,
        // depending on set_empty_strings_to_null either set it to 0 or an empty
        // string.
        if (!field.IsRequired()) {
          auto empty_value = opts_.set_empty_strings_to_null
                                 ? "0"
                                 : "_fbb.CreateSharedString(\"\")";
          code = value + ".empty() ? " + empty_value + " : " + code;
        }
        break;
      }
        // Vector fields come in several flavours, of the forms:
        //   _fbb.CreateVector(_o->field);
        //   _fbb.CreateVector((const utype*)_o->field.data(),
        //   _o->field.size()); _fbb.CreateVectorOfStrings(_o->field)
        //   _fbb.CreateVectorOfStructs(_o->field)
        //   _fbb.CreateVector<Offset<T>>(_o->field.size() [&](size_t i) {
        //     return CreateT(_fbb, _o->Get(i), rehasher);
        //   });
      case BASE_TYPE_VECTOR64:
      case BASE_TYPE_VECTOR: {
        auto vector_type = field.value.type.VectorType();
        switch (vector_type.base_type) {
          case BASE_TYPE_STRING: {
            if (NativeString(&field) == "std::string") {
              code += "_fbb.CreateVectorOfStrings(" + value + ")";
            } else {
              // Use by-function serialization to emulate
              // CreateVectorOfStrings(); this works also with non-std strings.
              code +=
                  "_fbb.CreateVector<::flatbuffers::Offset<::flatbuffers::"
                  "String>>"
                  " ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code +=
                  "return __va->__fbb->CreateString(__va->_" + value + "[i]);";
              code += " }, &_va )";
            }
            break;
          }
          case BASE_TYPE_STRUCT: {
            if (IsStruct(vector_type)) {
              const auto &struct_attrs =
                  field.value.type.struct_def->attributes;
              const auto native_type = struct_attrs.Lookup("native_type");
              if (native_type) {
                code += "_fbb.CreateVectorOfNativeStructs<";
                code += WrapInNameSpace(*vector_type.struct_def) + ", " +
                        native_type->constant + ">";
                code += "(" + value;
                const auto pack_name =
                    struct_attrs.Lookup("native_type_pack_name");
                if (pack_name) {
                  code += ", ::flatbuffers::Pack" + pack_name->constant;
                }
                code += ")";
              } else {
                // If the field uses 64-bit addressing, create a 64-bit vector.
                if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                  code += "_fbb.CreateVectorOfStructs64";
                } else {
                  code += "_fbb.CreateVectorOfStructs";
                  if (field.offset64) {
                    // This is normal 32-bit vector, with 64-bit addressing.
                    code += "64<::flatbuffers::Vector>";
                  }
                }
                code += "(" + value + ")";
              }
            } else {
              code += "_fbb.CreateVector<::flatbuffers::Offset<";
              code += WrapInNameSpace(*vector_type.struct_def) + ">> ";
              code += "(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return Create" + vector_type.struct_def->name;
              code += "(*__va->__fbb, ";
              if (field.native_inline) {
                code += "&(__va->_" + value + "[i])";
              } else {
                code += "__va->_" + value + "[i]" + GenPtrGet(field);
              }
              code += ", __va->__rehasher); }, &_va )";
            }
            break;
          }
          case BASE_TYPE_BOOL: {
            code += "_fbb.CreateVector(" + value + ")";
            break;
          }
          case BASE_TYPE_UNION: {
            code +=
                "_fbb.CreateVector<::flatbuffers::"
                "Offset<void>>(" +
                value +
                ".size(), [](size_t i, _VectorArgs *__va) { "
                "return __va->_" +
                value + "[i].Pack(*__va->__fbb, __va->__rehasher); }, &_va)";
            break;
          }
          case BASE_TYPE_UTYPE: {
            value = StripUnionType(value);
            auto underlying_type = GenTypeBasic(vector_type, false);
            const std::string &type = opts_.scoped_enums
                                          ? Name(*field.value.type.enum_def)
                                          : underlying_type;
            auto enum_value = "__va->_" + value + "[i].type";
            if (!opts_.scoped_enums)
              enum_value =
                  "static_cast<" + underlying_type + ">(" + enum_value + ")";

            code += "_fbb.CreateVector<" + type + ">(" + value +
                    ".size(), [](size_t i, _VectorArgs *__va) { return " +
                    enum_value + "; }, &_va)";
            break;
          }
          default: {
            if (field.value.type.enum_def &&
                !VectorElementUserFacing(vector_type)) {
              // For enumerations, we need to get access to the array data for
              // the underlying storage type (eg. uint8_t).
              const auto basetype = GenTypeBasic(
                  field.value.type.enum_def->underlying_type, false);
              code += "_fbb.CreateVectorScalarCast<" + basetype +
                      ">(::flatbuffers::data(" + value + "), " + value +
                      ".size())";
            } else if (field.attributes.Lookup("cpp_type")) {
              auto type = GenTypeBasic(vector_type, false);
              code += "_fbb.CreateVector<" + type + ">(" + value + ".size(), ";
              code += "[](size_t i, _VectorArgs *__va) { ";
              code += "return __va->__rehasher ? ";
              code += "static_cast<" + type + ">((*__va->__rehasher)";
              code += "(__va->_" + value + "[i]" + GenPtrGet(field) + ")) : 0";
              code += "; }, &_va )";
            } else {
              // If the field uses 64-bit addressing, create a 64-bit vector.
              if (field.value.type.base_type == BASE_TYPE_VECTOR64) {
                code += "_fbb.CreateVector64(" + value + ")";
              } else {
                code += "_fbb.CreateVector";
                if (field.offset64) {
                  // This is normal 32-bit vector, with 64-bit addressing.
                  code += "64<::flatbuffers::Vector>";
                }
                code += "(" + value + ")";
              }
            }
            break;
          }
        }

        // If set_empty_vectors_to_null option is enabled, for optional fields,
        // check to see if there actually is any data in _o->field before
        // attempting to access it.
        if (field.attributes.Lookup("nested_flatbuffer") ||
            (opts_.set_empty_vectors_to_null && !field.IsRequired())) {
          code = value + ".size() ? " + code + " : 0";
        }
        break;
      }
      case BASE_TYPE_UNION: {
        // _o->field.Pack(_fbb);
        code += value + ".Pack(_fbb)";
        break;
      }
      case BASE_TYPE_STRUCT: {
        if (IsStruct(field.value.type)) {
          const auto &struct_attribs = field.value.type.struct_def->attributes;
          const auto native_type = struct_attribs.Lookup("native_type");
          if (native_type) {
            code += "::flatbuffers::Pack";
            const auto pack_name =
                struct_attribs.Lookup("native_type_pack_name");
            if (pack_name) { code += pack_name->constant; }
            code += "(" + value + ")";
          } else if (field.native_inline) {
            code += "&" + value;
          } else {
            code += value + " ? " + value + GenPtrGet(field) + " : nullptr";
          }
        } else {
          // _o->field ? CreateT(_fbb, _o->field.get(), _rehasher);
          const std::string &type = field.value.type.struct_def->name;
          code += value + " ? Create" + type;
          code += "(_fbb, " + value;
          if (!field.native_inline) code += GenPtrGet(field);
          code += ", _rehasher) : 0";
        }
        break;
      }
      default: {
        code += value;
        break;
      }
    }
    return code;
  }